

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

make_tuple_string<std::tuple<char,int,double,char_const*>,0ul> * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,0ul>::make_abi_cxx11_
          (make_tuple_string<std::tuple<char,int,double,char_const*>,0ul> *this,
          tuple<char,_int,_double,_const_char_*> *param_1)

{
  allocator local_39;
  string local_38 [32];
  tuple<char,_int,_double,_const_char_*> *local_18;
  tuple<char,_int,_double,_const_char_*> *param_0_local;
  
  local_18 = param_1;
  param_0_local = (tuple<char,_int,_double,_const_char_*> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::__cxx11::string::string((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

static std::string make( TU const & ) { return ""; }